

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

CURLcode getalnum(char **ptr,char *alpnbuf,size_t buflen)

{
  char *__src;
  ulong __n;
  bool bVar1;
  bool bVar2;
  char *local_40;
  char *p;
  char *protop;
  size_t len;
  size_t buflen_local;
  char *alpnbuf_local;
  char **ptr_local;
  
  local_40 = *ptr;
  while( true ) {
    __src = local_40;
    bVar1 = false;
    if ((*local_40 != '\0') && (bVar1 = true, *local_40 != ' ')) {
      bVar1 = *local_40 == '\t';
    }
    if (!bVar1) break;
    local_40 = local_40 + 1;
  }
  while( true ) {
    bVar1 = false;
    if (*local_40 != '\0') {
      bVar2 = true;
      if (*local_40 != ' ') {
        bVar2 = *local_40 == '\t';
      }
      bVar1 = false;
      if ((!bVar2) && (bVar1 = false, *local_40 != ';')) {
        bVar1 = *local_40 != '=';
      }
    }
    if (!bVar1) break;
    local_40 = local_40 + 1;
  }
  __n = (long)local_40 - (long)__src;
  *ptr = local_40;
  if ((__n == 0) || (buflen <= __n)) {
    ptr_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    memcpy(alpnbuf,__src,__n);
    alpnbuf[__n] = '\0';
    ptr_local._4_4_ = CURLE_OK;
  }
  return ptr_local._4_4_;
}

Assistant:

static CURLcode getalnum(const char **ptr, char *alpnbuf, size_t buflen)
{
  size_t len;
  const char *protop;
  const char *p = *ptr;
  while(*p && ISBLANK(*p))
    p++;
  protop = p;
  while(*p && !ISBLANK(*p) && (*p != ';') && (*p != '='))
    p++;
  len = p - protop;
  *ptr = p;

  if(!len || (len >= buflen))
    return CURLE_BAD_FUNCTION_ARGUMENT;
  memcpy(alpnbuf, protop, len);
  alpnbuf[len] = 0;
  return CURLE_OK;
}